

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

bool __thiscall
google::protobuf::EnumValueDescriptorProto::_internal_has_options(EnumValueDescriptorProto *this)

{
  uint uVar1;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if (((uVar1 & 2) != 0) && (this->options_ == (EnumValueOptions *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
               ,0x2be4);
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: !value || options_ != nullptr: ");
    internal::LogFinisher::operator=(&local_49,other);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return SUB41((uVar1 & 2) >> 1,0);
}

Assistant:

inline bool EnumValueDescriptorProto::_internal_has_options() const {
  bool value = (_has_bits_[0] & 0x00000002u) != 0;
  PROTOBUF_ASSUME(!value || options_ != nullptr);
  return value;
}